

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyword_validator_factory.hpp
# Opt level: O0

unique_ptr<jsoncons::jsonschema::not_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::not_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
 __thiscall
jsoncons::jsonschema::
keyword_validator_factory<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
::make_not_validator
          (keyword_validator_factory<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
           *this,compilation_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                 *context,basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *sch,
          basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *parent,
          anchor_uri_map_type *anchor_dict)

{
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_RDX;
  compilation_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  *in_RSI;
  tuple<jsoncons::jsonschema::not_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::default_delete<jsoncons::jsonschema::not_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
  in_RDI;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_18446744073709551615UL>
  in_stack_00000000;
  anchor_uri_map_type *in_stack_00000020;
  string not_key [1];
  uri schema_location;
  unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffde0;
  string *in_stack_fffffffffffffdf0;
  compilation_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  *in_stack_fffffffffffffdf8;
  uri *in_stack_fffffffffffffe00;
  element_type *peVar1;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_fffffffffffffe08;
  element_type *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe10;
  span<std::__cxx11::string_const,18446744073709551615ul> local_188 [31];
  allocator<char> local_169;
  string local_168 [32];
  string local_148 [24];
  string *in_stack_fffffffffffffed0;
  undefined6 in_stack_fffffffffffffed8;
  undefined1 in_stack_fffffffffffffede;
  allocator<char> in_stack_fffffffffffffedf;
  element_type local_118;
  undefined1 auStack_f8 [24];
  string local_e0 [200];
  _Head_base<0UL,_jsoncons::jsonschema::not_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_false>
  this_01;
  
  this_01._M_head_impl =
       (not_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_> *
       )in_RDI.
        super__Tuple_impl<0UL,_jsoncons::jsonschema::not_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::default_delete<jsoncons::jsonschema::not_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
        .
        super__Head_base<0UL,_jsoncons::jsonschema::not_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_false>
        ._M_head_impl;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe10,(char *)in_stack_fffffffffffffe08,
             (allocator<char> *)in_stack_fffffffffffffe00);
  compilation_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
  make_schema_location
            ((compilation_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
              *)CONCAT17(in_stack_fffffffffffffedf,
                         CONCAT16(in_stack_fffffffffffffede,in_stack_fffffffffffffed8)),
             in_stack_fffffffffffffed0);
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator((allocator<char> *)(auStack_f8 + 0x17));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe10,(char *)in_stack_fffffffffffffe08,
             (allocator<char> *)in_stack_fffffffffffffe00);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffedf);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe10,(char *)in_stack_fffffffffffffe08,
             (allocator<char> *)in_stack_fffffffffffffe00);
  compilation_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
  get_custom_message(in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
  detail::span<std::__cxx11::string_const,18446744073709551615ul>::span<1ul>
            (local_188,(element_type (*) [1])&local_118);
  schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  ::make_cross_draft_schema_validator
            ((schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
              *)this_01._M_head_impl,in_RSI,in_RDX,in_stack_00000000,in_stack_00000020);
  std::
  make_unique<jsoncons::jsonschema::not_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::uri&,std::__cxx11::string,std::unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>
            (in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffdf8,
             (unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
              *)in_stack_fffffffffffffdf0);
  std::
  unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
  ::~unique_ptr(in_stack_fffffffffffffde0);
  std::__cxx11::string::~string(local_148);
  std::__cxx11::string::~string(local_168);
  std::allocator<char>::~allocator(&local_169);
  peVar1 = &local_118;
  this_00 = (element_type *)auStack_f8;
  do {
    this_00 = this_00 + -1;
    std::__cxx11::string::~string((string *)this_00);
  } while (this_00 != peVar1);
  jsoncons::uri::~uri((uri *)0x827638);
  return (__uniq_ptr_data<jsoncons::jsonschema::not_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::not_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>,_true,_true>
          )(__uniq_ptr_data<jsoncons::jsonschema::not_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::not_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>,_true,_true>
            )in_RDI.
             super__Tuple_impl<0UL,_jsoncons::jsonschema::not_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::default_delete<jsoncons::jsonschema::not_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
             .
             super__Head_base<0UL,_jsoncons::jsonschema::not_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_false>
             ._M_head_impl;
}

Assistant:

std::unique_ptr<not_validator<Json>> make_not_validator(const compilation_context<Json>& context, 
            const Json& sch, const Json& parent, anchor_uri_map_type& anchor_dict)
        {
            uri schema_location = context.make_schema_location("not");
            std::string not_key[] = { "not" };
            return jsoncons::make_unique<not_validator<Json>>(parent, schema_location, context.get_custom_message("not"), 
                factory_->make_cross_draft_schema_validator(context, sch, not_key, anchor_dict));
        }